

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O1

void __thiscall
Diligent::ResourceMappingImpl::AddResourceArray
          (ResourceMappingImpl *this,Char *Name,Uint32 StartIndex,IDeviceObject **ppObjects,
          Uint32 NumElements,bool bIsUnique)

{
  SpinLock *this_00;
  byte bVar1;
  undefined4 in_register_00000084;
  char (*Args_2) [80];
  undefined3 in_register_00000089;
  ulong uVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false,_false>,_bool>
  pVar3;
  string msg;
  IDeviceObject *pObject;
  string local_88;
  IDeviceObject *local_60;
  undefined4 local_54;
  Char *local_50;
  ulong local_48;
  ulong local_40;
  IDeviceObject **local_38;
  
  local_54 = CONCAT31(in_register_00000089,bIsUnique);
  Args_2 = (char (*) [80])CONCAT44(in_register_00000084,NumElements);
  if ((Name != (Char *)0x0) && (*Name != '\0')) {
    this_00 = &this->m_Lock;
    LOCK();
    bVar1 = (this->m_Lock).m_IsLocked._M_base._M_i;
    (this->m_Lock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
    local_50 = Name;
    local_38 = ppObjects;
    while ((bVar1 & 1) != 0) {
      Threading::SpinLock::Wait(this_00);
      LOCK();
      bVar1 = (this_00->m_IsLocked)._M_base._M_i;
      (this_00->m_IsLocked)._M_base._M_i = true;
      UNLOCK();
    }
    if (NumElements != 0) {
      local_48 = (ulong)NumElements;
      local_40 = (ulong)StartIndex;
      uVar2 = 0;
      do {
        local_60 = local_38[uVar2];
        ResMappingHashKey::ResMappingHashKey
                  ((ResMappingHashKey *)&local_88,local_50,true,(int)local_40 + (int)uVar2);
        pVar3 = std::
                _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::HashMapStringKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_emplace<Diligent::ResourceMappingImpl::ResMappingHashKey,Diligent::IDeviceObject*&>
                          ((_Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::STDAllocator<std::pair<Diligent::ResourceMappingImpl::ResMappingHashKey_const,Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,Diligent::HashMapStringKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&this->m_HashTable,&local_88,&local_60);
        if ((local_88._M_dataplus._M_p != (Char *)0x0) && ((long)local_88._M_string_length < 0)) {
          operator_delete__(local_88._M_dataplus._M_p);
        }
        if ((((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (*(IDeviceObject **)
             ((long)pVar3.first.
                    super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
             + 0x20) != local_60)) {
          if ((char)local_54 != '\0') {
            FormatString<char[43]>
                      (&local_88,(char (*) [43])"Resource with the same name already exists");
            DebugAssertionFailed
                      (local_88._M_dataplus._M_p,"AddResourceArray",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
                       ,0x37);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            FormatString<char[20],char_const*,char[80]>
                      (&local_88,(Diligent *)"Resource with name ",(char (*) [20])&local_50,
                       (char **)
                       " marked is unique, but already present in the hash.\nNew resource will be used\n."
                       ,Args_2);
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [80])0x0;
              (*(code *)DebugMessageCallback)(1,local_88._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          RefCntAutoPtr<Diligent::IDeviceObject>::operator=
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)
                     ((long)pVar3.first.
                            super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                     + 0x20),local_60);
        }
        uVar2 = uVar2 + 1;
      } while (local_48 != uVar2);
    }
    Threading::SpinLock::unlock(this_00);
  }
  return;
}

Assistant:

void ResourceMappingImpl::AddResourceArray(const Char* Name, Uint32 StartIndex, IDeviceObject* const* ppObjects, Uint32 NumElements, bool bIsUnique)
{
    if (Name == nullptr || *Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    for (Uint32 Elem = 0; Elem < NumElements; ++Elem)
    {
        auto* pObject = ppObjects[Elem];

        // Try to construct new element in place
        auto Elems = m_HashTable.emplace(ResMappingHashKey{Name, true /*Make copy*/, StartIndex + Elem}, pObject);
        // If there is already element with the same name, replace it
        if (!Elems.second && Elems.first->second != pObject)
        {
            if (bIsUnique)
            {
                UNEXPECTED("Resource with the same name already exists");
                LOG_WARNING_MESSAGE(
                    "Resource with name ", Name,
                    " marked is unique, but already present in the hash.\n"
                    "New resource will be used\n.");
            }
            Elems.first->second = pObject;
        }
    }
}